

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::TimingControl::visit<slang::ast::ASTSerializer>
          (TimingControl *this,ASTSerializer *visitor)

{
  (*(code *)(&DAT_004704d8 + *(int *)(&DAT_004704d8 + (ulong)this->kind * 4)))
            (this,this,&DAT_004704d8,&DAT_004704d8 + *(int *)(&DAT_004704d8 + (ulong)this->kind * 4)
            );
  return;
}

Assistant:

decltype(auto) TimingControl::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case TimingControlKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidTimingControl);
        CASE(Delay, DelayControl);
        CASE(Delay3, Delay3Control);
        CASE(SignalEvent, SignalEventControl);
        CASE(EventList, EventListControl);
        CASE(ImplicitEvent, ImplicitEventControl);
        CASE(RepeatedEvent, RepeatedEventControl);
        CASE(OneStepDelay, OneStepDelayControl);
        CASE(CycleDelay, CycleDelayControl);
        CASE(BlockEventList, BlockEventListControl);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}